

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

int png_deflate(png_t *png,char *outdata,int outlen,int *outwritten)

{
  long lVar1;
  int *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  z_stream *stream;
  int result;
  int local_4;
  
  lVar1 = *in_RDI;
  if (lVar1 == 0) {
    local_4 = -6;
  }
  else {
    *(undefined8 *)(lVar1 + 0x18) = in_RSI;
    *(int *)(lVar1 + 0x20) = in_EDX;
    local_4 = deflate(lVar1,2);
    *in_RCX = in_EDX - *(int *)(lVar1 + 0x20);
    if ((local_4 != 1) && (local_4 != 0)) {
      printf("%s\n",*(undefined8 *)(lVar1 + 0x30));
      local_4 = -7;
    }
  }
  return local_4;
}

Assistant:

static int png_deflate(png_t* png, char* outdata, int outlen, int *outwritten)
{
	int result;

	z_stream *stream = png->zs;


	if(!stream)
		return PNG_MEMORY_ERROR;

	stream->next_out = (unsigned char*)outdata;
	stream->avail_out = outlen;

	result = deflate(stream, Z_SYNC_FLUSH);

	*outwritten = outlen - stream->avail_out;

	if(result != Z_STREAM_END && result != Z_OK)
	{
		printf("%s\n", stream->msg);
		return PNG_ZLIB_ERROR;
	}

	return result;
}